

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  void *pvVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  undefined4 uVar5;
  iterator iVar6;
  _Node_iterator_base<std::pair<const_int,_double>,_false> _Var7;
  const_iterator __position;
  iterator iVar8;
  ulong uVar9;
  long lVar10;
  pointer pdVar11;
  undefined8 uVar12;
  __node_base _Var13;
  __node_base _Var14;
  __node_base _Var15;
  __node_base _Var16;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  pair<std::__detail::_Node_const_iterator<std::pair<const_int,_double>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_int,_double>,_false,_false>_>
  pVar17;
  function<int_(double)> func;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> keys;
  unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  grouped;
  vector<double,_std::allocator<double>_> test;
  unordered_map<int,_std::vector<double,_std::allocator<double>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>_>
  expectedGroupBy;
  undefined1 local_1ce;
  undefined1 local_1cd;
  undefined1 local_1cc;
  allocator_type local_1cb;
  allocator_type local_1ca;
  allocator_type local_1c9;
  vector<double,_std::allocator<double>_> local_1c8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  code *local_198;
  code *local_190;
  double local_188 [2];
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_178;
  __hashtable local_138;
  vector<double,_std::allocator<double>_> local_100;
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  local_e8;
  _Hash_node_base *local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  pointer local_90;
  undefined1 local_88 [8];
  double local_80;
  _Hashtable<int,_std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_78;
  double local_40 [2];
  
  local_e8._M_before_begin._M_nxt = (_Hash_node_base *)0x4000000000000000;
  local_e8._M_element_count = 0x4002666666666666;
  local_e8._M_buckets = (__buckets_ptr)0x3ff0000000000000;
  local_e8._M_bucket_count = 0x3ff3333333333333;
  local_e8._M_rehash_policy._M_max_load_factor = 0.0;
  local_e8._M_rehash_policy._4_4_ = 0x40080000;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_e8;
  std::vector<double,_std::allocator<double>_>::vector(&local_100,__l,(allocator_type *)&local_178);
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_190 = std::
              _Function_handler<int_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/groupBy/main.cpp:13:33)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<int_(double),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/groupBy/main.cpp:13:33)>
              ::_M_manager;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test groupBy...",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  local_188[0] = 1.0;
  local_188[1] = 1.2;
  __l_00._M_len = 2;
  __l_00._M_array = local_188;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_178,__l_00,&local_1c9);
  local_e8._M_element_count = (size_type)local_178._M_before_begin._M_nxt;
  local_e8._M_before_begin._M_nxt = (_Hash_node_base *)local_178._M_bucket_count;
  local_e8._M_bucket_count = (size_type)local_178._M_buckets;
  local_178._M_buckets = (__buckets_ptr)0x0;
  local_178._M_bucket_count = 0;
  local_178._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8._M_buckets = (__buckets_ptr)CONCAT44(local_e8._M_buckets._4_4_,1);
  local_40[0] = 2.0;
  local_40[1] = 2.3;
  __l_01._M_len = 2;
  __l_01._M_array = local_40;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_138,__l_01,&local_1ca);
  local_b0 = local_138._M_before_begin._M_nxt;
  local_e8._M_single_bucket = (__node_base_ptr)local_138._M_bucket_count;
  local_e8._M_rehash_policy._M_next_resize = (size_t)local_138._M_buckets;
  local_138._M_buckets = (__buckets_ptr)0x0;
  local_138._M_bucket_count = 0;
  local_138._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8._M_rehash_policy._M_max_load_factor = 2.8026e-45;
  local_80 = 3.0;
  __l_02._M_len = 1;
  __l_02._M_array = &local_80;
  std::vector<double,_std::allocator<double>_>::vector(&local_1c8,__l_02,&local_1cb);
  local_90 = local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_a0 = local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start._0_4_;
  uStack_9c = local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_;
  uStack_98 = local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_;
  uStack_94 = local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_;
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8 = 3;
  std::
  _Hashtable<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<int_const,std::vector<double,std::allocator<double>>>const*>
            ((_Hashtable<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_78,&local_e8,local_88,0,&local_1cc,&local_1cd,&local_1ce);
  lVar10 = 0x48;
  do {
    pvVar1 = *(void **)((long)&local_e8._M_buckets + lVar10);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1);
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x18);
  if ((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       *)local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start !=
      (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       *)0x0) {
    operator_delete(local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_138._M_buckets != (__buckets_ptr)0x0) {
    operator_delete(local_138._M_buckets);
  }
  if (local_178._M_buckets != (__buckets_ptr)0x0) {
    operator_delete(local_178._M_buckets);
  }
  local_138._M_buckets = &local_138._M_single_bucket;
  local_138._M_bucket_count = 1;
  local_138._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_138._M_element_count = 0;
  local_138._M_rehash_policy._M_max_load_factor = 1.0;
  local_138._M_rehash_policy._M_next_resize = 0;
  local_138._M_single_bucket = (__node_base_ptr)0x0;
  local_e8._M_buckets = &local_e8._M_single_bucket;
  local_e8._M_bucket_count = 1;
  local_e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_e8._M_element_count = 0;
  local_e8._M_rehash_policy._M_max_load_factor = 1.0;
  local_e8._M_rehash_policy._M_next_resize = 0;
  local_e8._M_single_bucket = (__node_base_ptr)0x0;
  if (local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar12 = 0;
    pdVar11 = local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_178._M_buckets = (__buckets_ptr)*pdVar11;
      if (local_198 == (code *)0x0) {
        std::__throw_bad_function_call();
        goto LAB_00104878;
      }
      uVar5 = (*local_190)(&local_1a8,&local_178);
      local_178._M_bucket_count = (size_type)*pdVar11;
      local_178._M_buckets = (__buckets_ptr)CONCAT44(local_178._M_buckets._4_4_,uVar5);
      iVar6 = std::
              _Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              ::_M_emplace<std::pair<int_const,double>>
                        ((_Hashtable<int,std::pair<int_const,double>,std::allocator<std::pair<int_const,double>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
                          *)&local_e8,uVar12,&local_178);
      uVar12 = *(undefined8 *)
                iVar6.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur;
      pdVar11 = pdVar11 + 1;
    } while (pdVar11 !=
             local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_178._M_buckets = &local_178._M_single_bucket;
  local_178._M_bucket_count = 1;
  local_178._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_178._M_element_count = 0;
  local_178._M_rehash_policy._M_max_load_factor = 1.0;
  local_178._M_rehash_policy._M_next_resize = 0;
  local_178._M_single_bucket = (__node_base_ptr)0x0;
  if (local_e8._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var13._M_nxt = local_e8._M_before_begin._M_nxt;
    do {
      local_188[0] = (double)CONCAT44(local_188[0]._4_4_,*(undefined4 *)&_Var13._M_nxt[1]._M_nxt);
      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&local_178;
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_178,local_188,&local_1c8);
      _Var13._M_nxt = (_Var13._M_nxt)->_M_nxt;
    } while (_Var13._M_nxt != (_Hash_node_base *)0x0);
  }
  if (local_178._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var14._M_nxt = local_178._M_before_begin._M_nxt;
    do {
      pVar17 = std::
               _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
               ::equal_range(&local_e8,(key_type *)(_Var14._M_nxt + 1));
      _Var7._M_cur = (__node_type *)
                     pVar17.first.super__Node_iterator_base<std::pair<const_int,_double>,_false>.
                     _M_cur;
      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if ((_Node_iterator_base<std::pair<const_int,_double>,_false>)_Var7._M_cur !=
          pVar17.second.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur.
          super__Node_iterator_base<std::pair<const_int,_double>,_false>) {
        __position._M_current = (double *)0x0;
        do {
          local_188[0] = *(double *)
                          ((long)&((_Var7._M_cur)->
                                  super__Hash_node_value<std::pair<const_int,_double>,_false>).
                                  super__Hash_node_value_base<std::pair<const_int,_double>_>.
                                  _M_storage._M_storage + 8);
          iVar8 = std::vector<double,_std::allocator<double>_>::_M_insert_rval
                            (&local_1c8,__position,local_188);
          __position._M_current = iVar8._M_current + 1;
          _Var7._M_cur = (__node_type *)((_Var7._M_cur)->super__Hash_node_base)._M_nxt;
        } while ((_Node_iterator_base<std::pair<const_int,_double>,_false>)_Var7._M_cur !=
                 pVar17.second.super__Node_iterator_base<std::pair<const_int,_double>,_false>._M_cur
                 .super__Node_iterator_base<std::pair<const_int,_double>,_false>);
      }
      std::
      _Hashtable<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<int_const&,std::vector<double,std::allocator<double>>&>
                ((_Hashtable<int,std::pair<int_const,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int_const,std::vector<double,std::allocator<double>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_138,_Var14._M_nxt + 1,&local_1c8);
      if ((_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start !=
          (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)0x0) {
        operator_delete(local_1c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      _Var14._M_nxt = (_Var14._M_nxt)->_M_nxt;
    } while (_Var14._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_178);
  std::
  _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable(&local_e8);
  for (_Var15._M_nxt = local_138._M_before_begin._M_nxt;
      _Var16._M_nxt = local_78._M_before_begin._M_nxt, _Var15._M_nxt != (_Hash_node_base *)0x0;
      _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt) {
    p_Var2 = _Var15._M_nxt[2]._M_nxt;
    p_Var3 = _Var15._M_nxt[3]._M_nxt;
    if (p_Var2 != p_Var3) {
      uVar9 = (long)p_Var3 - (long)p_Var2 >> 3;
      lVar10 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var2,p_Var3,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var2,p_Var3);
    }
  }
  for (; _Var16._M_nxt != (_Hash_node_base *)0x0; _Var16._M_nxt = (_Var16._M_nxt)->_M_nxt) {
    p_Var2 = _Var16._M_nxt[2]._M_nxt;
    p_Var3 = _Var16._M_nxt[3]._M_nxt;
    if (p_Var2 != p_Var3) {
      uVar9 = (long)p_Var3 - (long)p_Var2 >> 3;
      lVar10 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var2,p_Var3,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var2,p_Var3);
    }
  }
  bVar4 = std::__detail::
          _Equality<int,_std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::_M_equal((_Equality<int,_std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      *)&local_78,&local_138);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"passed!",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::
    _Hashtable<int,_std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_138);
    std::
    _Hashtable<int,_std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<const_int,_std::vector<double,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_78);
    if (local_198 != (code *)0x0) {
      (*local_198)(&local_1a8,&local_1a8,3);
    }
    if (local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
LAB_00104878:
  __assert_fail("expectedGroupBy==grouped",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/groupBy/main.cpp"
                ,0x1e,"int main()");
}

Assistant:

int main(){
     
  vector<double> test={1.0, 1.2, 2.0, 2.3, 3.0};
  function< int(double) > func= [] (const double & element){return (int)element;};
  
  cout << "Test groupBy..." << endl;
  unordered_map<int, vector<double> > expectedGroupBy={
      make_pair(1, vector<double>{1.0, 1.2}),      
      make_pair(2, vector<double>{2.0, 2.3}),      
      make_pair(3, vector<double>{3.0})      
  };
  auto grouped = Functional::groupBy(test, func);  
  
  for( auto & kv : grouped ){
      sort(kv.second.begin(), kv.second.end());
  }  
  for( auto & kv : expectedGroupBy ){
      sort(kv.second.begin(), kv.second.end());
  }
  
  assert(expectedGroupBy==grouped);
  cout << "passed!" << endl;
  
  return 0;

}